

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O0

void __thiscall TLeonardoHeap<double>::dequeue_max(TLeonardoHeap<double> *this,size_t element)

{
  size_t element_local;
  TLeonardoHeap<double> *this_local;
  
  if (this->first_tree < 2) {
    if (this->first_tree == 0) {
      this->tree_vector = this->tree_vector >> 1;
      this->first_tree = 1;
    }
    else {
      this->tree_vector = this->tree_vector >> 1;
      this->first_tree = this->first_tree + 1;
      while (((ulong)this->first_tree < this->N + 1 && ((this->tree_vector & 1) == 0))) {
        this->first_tree = this->first_tree + 1;
        this->tree_vector = this->tree_vector >> 1;
      }
    }
  }
  else {
    this->tree_vector = this->tree_vector << 1 ^ 3;
    this->first_tree = this->first_tree - 2;
    filter(this,(element - Leonardo_k[this->first_tree]) - 1,(long)(int)(this->first_tree + 1),false
          );
    this->tree_vector = this->tree_vector << 1 | 1;
    filter(this,element - 1,(ulong)this->first_tree,false);
  }
  return;
}

Assistant:

inline void TLeonardoHeap<T>::dequeue_max(size_t element) {
	if(first_tree >= 2) {	// Root is of order greater than two
		// Expose the two child nodes as tree roots
		// Restore the ascending root and max-heap properties of the exposed tree to the left
		tree_vector = (tree_vector << 1) ^ 3;	// w1 -> w01
		first_tree -= 2;
		filter(element-Leonardo_k[first_tree]-1, first_tree+1, false);
		// Restore the ascending root and max-heap properties of the exposed tree to the right
		tree_vector = (tree_vector << 1) | 1;	// w01 -> w011
		filter(element-1, first_tree, false);
	} else if(first_tree == 0) {
		// Remove the Lt_0 tree, leaving the Lt_1 tree on the right
		tree_vector >>= 1;
		first_tree = 1;
	} else {	// The rightmost root is of order 1
		// Search for the next tree
		tree_vector >>=1;
		first_tree++;
		for(; first_tree<N+1; first_tree++, tree_vector>>=1) { if(tree_vector & 1) { break; } }
	}
}